

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O2

int32_t duckdb::GetGroupIndex(DataChunk *args,idx_t row,int32_t *result)

{
  reference this;
  int32_t iVar1;
  UnifiedVectorFormat format;
  
  if ((ulong)(((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68) < 3) {
    *result = 0;
    iVar1 = 1;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    this = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
    Vector::ToUnifiedFormat(this,args->count,&format);
    if ((format.sel)->sel_vector != (sel_t *)0x0) {
      row = (idx_t)(format.sel)->sel_vector[row];
    }
    if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[row >> 6] >>
         (row & 0x3f) & 1) != 0)) {
      *result = *(int32_t *)(format.data + row * 4);
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  }
  return iVar1;
}

Assistant:

int32_t GetGroupIndex(DataChunk &args, idx_t row, int32_t &result) {
	if (args.ColumnCount() < 3) {
		result = 0;
		return true;
	}
	UnifiedVectorFormat format;
	args.data[2].ToUnifiedFormat(args.size(), format);
	idx_t index = format.sel->get_index(row);
	if (!format.validity.RowIsValid(index)) {
		return false;
	}
	result = UnifiedVectorFormat::GetData<int32_t>(format)[index];
	return true;
}